

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSampleConsensusProblem.hpp
# Opt level: O0

void __thiscall
opengv::sac::MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::setUniformIndices
          (MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,
          vector<int,_std::allocator<int>_> *N)

{
  size_type __new_size;
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar1;
  element_type *peVar2;
  reference pvVar3;
  reference this_01;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_00000038;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_00000040;
  int i;
  size_t j;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffffa8;
  __shared_ptr<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *in_stack_ffffffffffffffb0;
  size_type sVar4;
  undefined4 local_1c;
  undefined8 local_18;
  
  __new_size = in_RDI + 0x10;
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x6f733e);
  std::
  __shared_ptr<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  reset<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::
  __shared_ptr_access<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x6f735b);
  std::vector<int,_std::allocator<int>_>::size(in_RSI);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)this_00,__new_size);
  local_18 = 0;
  while( true ) {
    sVar4 = local_18;
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    if (sVar1 <= sVar4) break;
    peVar2 = std::
             __shared_ptr_access<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](peVar2,local_18);
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,local_18);
    std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
    local_1c = 0;
    while( true ) {
      in_stack_ffffffffffffffa4 = local_1c;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,local_18);
      if (*pvVar3 <= in_stack_ffffffffffffffa4) break;
      in_stack_ffffffffffffffa0 = local_1c;
      peVar2 = std::
               __shared_ptr_access<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)CONCAT44(in_stack_ffffffffffffffa4,local_1c));
      this_01 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](peVar2,local_18);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_1c);
      *pvVar3 = in_stack_ffffffffffffffa0;
      local_1c = local_1c + 1;
    }
    local_18 = local_18 + 1;
  }
  std::
  __shared_ptr_access<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void
opengv::sac::MultiSampleConsensusProblem<M>::setUniformIndices(
    std::vector<int> N)
{
  indices_.reset( new std::vector< std::vector<int> >() );
  indices_->resize(N.size());
  for( size_t j = 0; j < N.size(); j++ )
  {
    (*indices_)[j].resize(N[j]);
    for( int i = 0; i < N[j]; ++i )
      (*indices_)[j][i] = i;
  }
  shuffled_indices_ = *indices_;
}